

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O3

int set_reasons(ASN1_BIT_STRING **preas,char *value)

{
  char *__s2;
  char *pcVar1;
  int iVar2;
  OPENSSL_STACK *sk;
  size_t sVar3;
  void *pvVar4;
  ASN1_BIT_STRING *a;
  size_t sVar5;
  char **ppcVar6;
  
  if (*preas == (ASN1_BIT_STRING *)0x0) {
    sk = (OPENSSL_STACK *)X509V3_parse_list(value);
    if (sk == (OPENSSL_STACK *)0x0) {
      iVar2 = 0;
    }
    else {
      sVar3 = OPENSSL_sk_num(sk);
      if (sVar3 != 0) {
        sVar3 = 0;
        do {
          ppcVar6 = &reason_flags[1].lname;
          pvVar4 = OPENSSL_sk_value(sk,sVar3);
          __s2 = *(char **)((long)pvVar4 + 8);
          a = *preas;
          if (a == (ASN1_BIT_STRING *)0x0) {
            a = (ASN1_BIT_STRING *)ASN1_BIT_STRING_new();
            *preas = a;
            if (a != (ASN1_BIT_STRING *)0x0) goto LAB_00316eba;
LAB_00316f09:
            iVar2 = 0;
            goto LAB_00316f0b;
          }
LAB_00316eba:
          while (iVar2 = strcmp(ppcVar6[-2],__s2), iVar2 != 0) {
            pcVar1 = *ppcVar6;
            ppcVar6 = ppcVar6 + 3;
            if (pcVar1 == (char *)0x0) goto LAB_00316f09;
          }
          iVar2 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)a,(int)ppcVar6[-4],1);
          if (iVar2 == 0) goto LAB_00316f09;
          sVar3 = sVar3 + 1;
          sVar5 = OPENSSL_sk_num(sk);
        } while (sVar3 < sVar5);
      }
      iVar2 = 1;
LAB_00316f0b:
      OPENSSL_sk_pop_free_ex(sk,sk_CONF_VALUE_call_free_func,X509V3_conf_free);
    }
  }
  else {
    iVar2 = 0;
    ERR_put_error(0x14,0,0xa3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_crld.cc"
                  ,0xb3);
  }
  return iVar2;
}

Assistant:

static int set_reasons(ASN1_BIT_STRING **preas, const char *value) {
  if (*preas) {
    // Duplicate "reasons" or "onlysomereasons" key.
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_VALUE);
    return 0;
  }
  int ret = 0;
  STACK_OF(CONF_VALUE) *rsk = X509V3_parse_list(value);
  if (!rsk) {
    return 0;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(rsk); i++) {
    const char *bnam = sk_CONF_VALUE_value(rsk, i)->name;
    if (!*preas) {
      *preas = ASN1_BIT_STRING_new();
      if (!*preas) {
        goto err;
      }
    }
    const BIT_STRING_BITNAME *pbn;
    for (pbn = reason_flags; pbn->lname; pbn++) {
      if (!strcmp(pbn->sname, bnam)) {
        if (!ASN1_BIT_STRING_set_bit(*preas, pbn->bitnum, 1)) {
          goto err;
        }
        break;
      }
    }
    if (!pbn->lname) {
      goto err;
    }
  }
  ret = 1;

err:
  sk_CONF_VALUE_pop_free(rsk, X509V3_conf_free);
  return ret;
}